

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV3MeshWeightsBlock(Parser *this,Mesh *mesh)

{
  bool bVar1;
  byte *pbVar2;
  byte bVar3;
  int local_44;
  uint iNumBones;
  uint iNumVertices;
  Mesh *local_38;
  
  iNumVertices = 0;
  iNumBones = 0;
  local_44 = 0;
  local_38 = mesh;
  do {
    while( true ) {
      pbVar2 = (byte *)this->filePtr;
      bVar3 = *pbVar2;
      if (bVar3 != 0x2a) break;
      this->filePtr = (char *)(pbVar2 + 1);
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMVERTEX",0xe);
      if (bVar1) {
        ParseLV4MeshLong(this,&iNumVertices);
      }
      else {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMBONE",0xc);
        if (bVar1) {
          ParseLV4MeshLong(this,&iNumBones);
        }
        else {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_BONE_LIST",0xe);
          if (bVar1) {
            ParseLV4MeshBones(this,iNumBones,local_38);
          }
          else {
            bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_BONE_VERTEX_LIST",0x15);
            if (!bVar1) {
              pbVar2 = (byte *)this->filePtr;
              bVar3 = *pbVar2;
              break;
            }
            ParseLV4MeshBonesVertices(this,iNumVertices,local_38);
          }
        }
      }
    }
    if ((bVar3 - 0xc < 2) || (bVar3 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003e28cd;
      this->iLineNumber = this->iLineNumber + 1;
      bVar1 = true;
    }
    else {
      if (bVar3 == 0x7b) {
        local_44 = local_44 + 1;
      }
      else if (bVar3 == 0x7d) {
        local_44 = local_44 + -1;
        if (local_44 == 0) {
          this->filePtr = (char *)(pbVar2 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar3 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_WEIGHTS chunk (Level 3)");
      }
LAB_003e28cd:
      bVar1 = false;
    }
    this->bLastWasEndLine = bVar1;
    this->filePtr = (char *)(pbVar2 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshWeightsBlock(ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumVertices = 0, iNumBones = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Number of bone vertices ...
            if (TokenMatch(filePtr,"MESH_NUMVERTEX" ,14))
            {
                ParseLV4MeshLong(iNumVertices);
                continue;
            }
            // Number of bones
            if (TokenMatch(filePtr,"MESH_NUMBONE" ,12))
            {
                ParseLV4MeshLong(iNumBones);
                continue;
            }
            // parse the list of bones
            if (TokenMatch(filePtr,"MESH_BONE_LIST" ,14))
            {
                ParseLV4MeshBones(iNumBones,mesh);
                continue;
            }
            // parse the list of bones vertices
            if (TokenMatch(filePtr,"MESH_BONE_VERTEX_LIST" ,21) )
            {
                ParseLV4MeshBonesVertices(iNumVertices,mesh);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_WEIGHTS");
    }
    return;
}